

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.cpp
# Opt level: O0

void __thiscall groundupdb::BucketQuery::BucketQuery(BucketQuery *this,string *bucket)

{
  string *bucket_local;
  BucketQuery *this_local;
  
  Query::Query(&this->super_Query);
  (this->super_Query)._vptr_Query = (_func_int **)&PTR__BucketQuery_002c6aa0;
  std::make_unique<groundupdb::BucketQuery::Impl,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mImpl);
  return;
}

Assistant:

BucketQuery::BucketQuery(std::string& bucket)
  : mImpl(std::make_unique<Impl>(bucket))
{
  ;
}